

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O2

int str_byte(lua_State *L)

{
  size_t in_RAX;
  char *pcVar1;
  lua_Integer lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint space;
  size_t l;
  
  l = in_RAX;
  pcVar1 = luaL_checklstring(L,1,&l);
  lVar2 = luaL_optinteger(L,2,1);
  uVar4 = (lVar2 >> 0x3f & l + 1) + lVar2;
  space = 0;
  uVar3 = 0;
  if (0 < (long)uVar4) {
    uVar3 = uVar4;
  }
  lVar2 = luaL_optinteger(L,3,uVar3);
  uVar3 = (lVar2 >> 0x3f & l + 1) + lVar2;
  if ((long)uVar3 < 1) {
    uVar3 = 0;
  }
  if ((long)uVar4 < 2) {
    uVar4 = 1;
  }
  if (l <= uVar3) {
    uVar3 = l;
  }
  if (uVar4 <= uVar3) {
    space = ((int)uVar3 - (int)uVar4) + 1;
    if ((long)((long)(int)space + uVar4) <= (long)uVar3) {
      luaL_error(L,"string slice too long");
    }
    luaL_checkstack(L,space,"string slice too long");
    uVar3 = 0;
    uVar5 = 0;
    if (0 < (int)space) {
      uVar5 = (ulong)space;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      lua_pushinteger(L,(ulong)(byte)pcVar1[uVar3 + (uVar4 - 1)]);
    }
  }
  return space;
}

Assistant:

static int str_byte (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  ptrdiff_t posi = posrelat(luaL_optinteger(L, 2, 1), l);
  ptrdiff_t pose = posrelat(luaL_optinteger(L, 3, posi), l);
  int n, i;
  if (posi <= 0) posi = 1;
  if ((size_t)pose > l) pose = l;
  if (posi > pose) return 0;  /* empty interval; return no values */
  n = (int)(pose -  posi + 1);
  if (posi + n <= pose)  /* overflow? */
    luaL_error(L, "string slice too long");
  luaL_checkstack(L, n, "string slice too long");
  for (i=0; i<n; i++)
    lua_pushinteger(L, uchar(s[posi+i-1]));
  return n;
}